

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_utils.c
# Opt level: O2

int mk_utils_utime2gmt(char **data,time_t date)

{
  undefined8 *puVar1;
  long *plVar2;
  ushort uVar3;
  ushort uVar4;
  ushort uVar5;
  int iVar6;
  char *pcVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  int iVar11;
  time_t tVar12;
  uint uVar13;
  void *pvVar14;
  tm *ptVar15;
  uint uVar16;
  long lVar17;
  uint uVar18;
  long lVar19;
  time_t date_local;
  
  date_local = date;
  if (date == 0) {
    date_local = time((time_t *)0x0);
    if (date_local == -1) {
      return -1;
    }
  }
  else {
    pvVar14 = pthread_getspecific(mk_tls_cache_gmtext);
    if (pvVar14 != (void *)0x0) {
      lVar19 = 0;
      while (lVar17 = lVar19, lVar17 + 0x30 != 0x210) {
        lVar19 = lVar17 + 0x30;
        if (*(long *)((long)pvVar14 + lVar17) == date) {
          pcVar7 = *data;
          puVar1 = (undefined8 *)((long)pvVar14 + lVar17 + 8);
          uVar8 = *puVar1;
          uVar9 = puVar1[1];
          puVar1 = (undefined8 *)((long)pvVar14 + lVar17 + 0x18);
          uVar10 = puVar1[1];
          *(undefined8 *)(pcVar7 + 0x10) = *puVar1;
          *(undefined8 *)(pcVar7 + 0x18) = uVar10;
          *(undefined8 *)pcVar7 = uVar8;
          *(undefined8 *)(pcVar7 + 8) = uVar9;
          plVar2 = (long *)((long)pvVar14 + lVar17 + 0x28);
          *plVar2 = *plVar2 + 1;
          return 0x1f;
        }
      }
    }
  }
  ptVar15 = (tm *)pthread_getspecific(mk_tls_cache_gmtime);
  if (ptVar15 != (tm *)0x0) {
    ptVar15 = gmtime_r(&date_local,ptVar15);
    tVar12 = date_local;
    if (ptVar15 != (tm *)0x0) {
      iVar11 = ptVar15->tm_mday;
      uVar3 = (ushort)ptVar15->tm_hour;
      uVar4 = (ushort)ptVar15->tm_sec;
      uVar5 = (ushort)ptVar15->tm_min;
      pcVar7 = *data;
      iVar6 = ptVar15->tm_wday;
      uVar18 = ptVar15->tm_year + 0x76c;
      pcVar7[4] = mk_date_wd[iVar6][4];
      *(undefined4 *)pcVar7 = *(undefined4 *)mk_date_wd[iVar6];
      uVar16 = (uint)(ushort)iVar11;
      pcVar7[5] = (char)(uVar16 / 10) + '0';
      pcVar7[6] = (byte)(uVar16 % 10) | 0x30;
      pcVar7[7] = ' ';
      *(undefined4 *)(pcVar7 + 8) = *(undefined4 *)mk_date_ym[ptVar15->tm_mon];
      pcVar7[0xc] = (byte)((ushort)((uVar18 & 0xffff) / 1000) % 10) | 0x30;
      pcVar7[0xd] = (byte)(((uVar18 & 0xffff) / 100) % 10) | 0x30;
      pcVar7[0xe] = (byte)(((uVar18 & 0xffff) / 10) % 10) | 0x30;
      pcVar7[0xf] = (byte)((uVar18 & 0xffff) % 10) | 0x30;
      pcVar7[0x10] = ' ';
      pcVar7[0x11] = (char)(uVar3 / 10) + '0';
      pcVar7[0x12] = (byte)(uVar3 % 10) | 0x30;
      pcVar7[0x13] = ':';
      pcVar7[0x14] = (char)(uVar5 / 10) + '0';
      pcVar7[0x15] = (byte)(uVar5 % 10) | 0x30;
      pcVar7[0x16] = ':';
      pcVar7[0x17] = (char)(uVar4 / 10) + '0';
      pcVar7[0x18] = (byte)(uVar4 % 10) | 0x30;
      pcVar7[0x19] = ' ';
      pcVar7[0x1a] = 'G';
      pcVar7[0x1b] = 'M';
      pcVar7[0x1c] = 'T';
      pcVar7[0x1c] = 'T';
      pcVar7[0x1d] = '\r';
      pcVar7[0x1e] = '\n';
      pcVar7[0x1f] = '\0';
      pcVar7 = *data;
      pvVar14 = pthread_getspecific(mk_tls_cache_gmtext);
      uVar16 = 1;
      uVar18 = 0;
      for (lVar19 = 0; lVar19 != 0x1b0; lVar19 = lVar19 + 0x30) {
        uVar13 = uVar16;
        if (*(ulong *)((long)pvVar14 + (ulong)uVar18 * 0x30 + 0x28) <=
            *(ulong *)((long)pvVar14 + lVar19 + 0x58)) {
          uVar13 = uVar18;
        }
        uVar18 = uVar13;
        uVar16 = uVar16 + 1;
      }
      lVar19 = (ulong)uVar18 * 0x30;
      *(undefined8 *)((long)pvVar14 + lVar19 + 0x28) = 1;
      *(time_t *)((long)pvVar14 + lVar19) = tVar12;
      uVar8 = *(undefined8 *)(pcVar7 + 8);
      uVar9 = *(undefined8 *)(pcVar7 + 0x10);
      uVar10 = *(undefined8 *)(pcVar7 + 0x18);
      puVar1 = (undefined8 *)((long)pvVar14 + lVar19 + 8);
      *puVar1 = *(undefined8 *)pcVar7;
      puVar1[1] = uVar8;
      puVar1 = (undefined8 *)((long)pvVar14 + lVar19 + 0x18);
      *puVar1 = uVar9;
      puVar1[1] = uVar10;
      return 0x1f;
    }
    return -1;
  }
  mk_print(0x1003,"Bug found in %s() at %s:%d","mk_utils_utime2gmt",
           "/workspace/llm4binary/github/license_c_cmakelists/monkey[P]monkey/mk_server/mk_utils.c",
           0xd6);
  abort();
}

Assistant:

int mk_utils_utime2gmt(char **data, time_t date)
{
    const int size = 31;
    unsigned short year, mday, hour, min, sec;
    char *buf=0;
    struct tm *gtm;

    if (date == 0) {
        if ((date = time(NULL)) == -1) {
            return -1;
        }
    }
    else {
        /* Maybe it's converted already? */
        if (mk_utils_gmt_cache_get(data, date) == MK_TRUE) {
            return size;
        }
    }

    /* Convert unix time to struct tm */
    gtm = MK_TLS_GET(mk_tls_cache_gmtime);

    /* If this function was invoked from a non-thread context it should exit */
    mk_bug(!gtm);
    gtm = gmtime_r(&date, gtm);
    if (!gtm) {
        return -1;
    }

    /* struct tm -> tm_year counts number of years after 1900 */
    year = gtm->tm_year + 1900;

    /* Signed division is slow, by using unsigned we gain 25% speed */
    mday = gtm->tm_mday;
    hour = gtm->tm_hour;
    min = gtm->tm_min;
    sec = gtm->tm_sec;

    /* Compose template */
    buf = *data;

    /* Week day */
    memcpy(buf, mk_date_wd[gtm->tm_wday], 5);
    buf += 5;

    /* Day of the month */
    *buf++ = ('0' + (mday / 10));
    *buf++ = ('0' + (mday % 10));
    *buf++ = ' ';

    /* Month */
    memcpy(buf, mk_date_ym[gtm->tm_mon], 4);
    buf += 4;

    /* Year */
    *buf++ = ('0' + (year / 1000) % 10);
    *buf++ = ('0' + (year / 100) % 10);
    *buf++ = ('0' + (year / 10) % 10);
    *buf++ = ('0' + (year % 10));
    *buf++ = ' ';

    /* Hour */
    *buf++ = ('0' + (hour / 10));
    *buf++ = ('0' + (hour % 10));
    *buf++ = ':';

    /* Minutes */
    *buf++ = ('0' + (min / 10));
    *buf++ = ('0' + (min % 10));
    *buf++ = ':';

    /* Seconds */
    *buf++ = ('0' + (sec / 10));
    *buf++ = ('0' + (sec % 10));

    /* GMT Time zone + CRLF */
    memcpy(buf, " GMT\r\n\0", 7);

    /* Add new entry to the cache */
    mk_utils_gmt_cache_add(*data, date);

    /* Set mk_ptr_t data len */
    return size;
}